

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.cpp
# Opt level: O2

void duckdb::UDFWrapper::RegisterAggrFunction
               (AggregateFunction *aggr_function,ClientContext *context,LogicalType *varargs)

{
  CreateAggregateFunctionInfo info;
  AggregateFunction local_300;
  CreateAggregateFunctionInfo local_1d0;
  
  LogicalType::operator=
            (&(aggr_function->super_BaseScalarFunction).super_SimpleFunction.varargs,varargs);
  AggregateFunction::AggregateFunction(&local_300,aggr_function);
  CreateAggregateFunctionInfo::CreateAggregateFunctionInfo(&local_1d0,&local_300);
  AggregateFunction::~AggregateFunction(&local_300);
  ClientContext::RegisterFunction(context,&local_1d0.super_CreateFunctionInfo);
  CreateAggregateFunctionInfo::~CreateAggregateFunctionInfo(&local_1d0);
  return;
}

Assistant:

void UDFWrapper::RegisterAggrFunction(AggregateFunction aggr_function, ClientContext &context, LogicalType varargs) {
	aggr_function.varargs = std::move(varargs);
	CreateAggregateFunctionInfo info(std::move(aggr_function));
	context.RegisterFunction(info);
}